

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausProcessClausesCut2(Clu_Man_t *p,Fra_Sml_t *pSimMan,Dar_Cut_t *pCut,int *pScores)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint *pSims [16];
  
  uVar5 = *(uint *)&pCut->field_0x4;
  if (0x5fffffff < uVar5 + 0xc0000000) {
    __assert_fail("pCut->nLeaves > 1 && pCut->nLeaves < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                  ,0xfe,
                  "int Fra_ClausProcessClausesCut2(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
  }
  iVar6 = pSimMan->nWordsTotal;
  iVar1 = p->nSimWordsPref;
  uVar2 = iVar6 - iVar1;
  if ((uVar2 & 7) != 0) {
    __assert_fail("nWordsForSim % 8 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                  ,0xff,
                  "int Fra_ClausProcessClausesCut2(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
  }
  for (uVar7 = 0; uVar5 >> 0x1d != uVar7; uVar7 = uVar7 + 1) {
    pSims[uVar7] = (uint *)((long)&pSimMan[1].pAig +
                           (long)pCut->pLeaves[uVar7] * (long)iVar6 * 4 + (long)iVar1 * 4);
  }
  pScores[0xc] = 0;
  pScores[0xd] = 0;
  pScores[0xe] = 0;
  pScores[0xf] = 0;
  pScores[8] = 0;
  pScores[9] = 0;
  pScores[10] = 0;
  pScores[0xb] = 0;
  pScores[4] = 0;
  pScores[5] = 0;
  pScores[6] = 0;
  pScores[7] = 0;
  pScores[0] = 0;
  pScores[1] = 0;
  pScores[2] = 0;
  pScores[3] = 0;
  uVar8 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    for (iVar6 = 0; iVar6 != 0x20; iVar6 = iVar6 + 1) {
      uVar5 = 0;
      for (uVar3 = 0; *(uint *)&pCut->field_0x4 >> 0x1d != uVar3; uVar3 = uVar3 + 1) {
        uVar2 = 1 << ((byte)uVar3 & 0x1f);
        if ((pSims[uVar3][uVar8] & 1 << ((byte)iVar6 & 0x1f)) == 0) {
          uVar2 = 0;
        }
        uVar5 = uVar5 | uVar2;
      }
      pScores[(int)uVar5] = pScores[(int)uVar5] + 1;
    }
  }
  uVar5 = 0;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    uVar2 = 1 << ((byte)lVar4 & 0x1f);
    if (pScores[lVar4] == 0) {
      uVar2 = 0;
    }
    uVar5 = uVar5 | uVar2;
  }
  return uVar5;
}

Assistant:

int Fra_ClausProcessClausesCut2( Clu_Man_t * p, Fra_Sml_t * pSimMan, Dar_Cut_t * pCut, int * pScores )
{
    unsigned * pSims[16], uWord;
    int iMint, i, k, b;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;
    // compute parameters
    assert( pCut->nLeaves > 1 && pCut->nLeaves < 5 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pLeaves[i] ) + p->nSimWordsPref;
    // add combinational patterns
    memset( pScores, 0, sizeof(int) * 16 );
    for ( i = 0; i < nWordsForSim; i++ )
        for ( k = 0; k < 32; k++ )
        {
            iMint = 0;
            for ( b = 0; b < (int)pCut->nLeaves; b++ )
                if ( pSims[b][i] & (1 << k) )
                    iMint |= (1 << b);
            pScores[iMint]++;
        }
    // collect patterns
    uWord = 0;
    for ( i = 0; i < 16; i++ )
        if ( pScores[i] )
            uWord |= (1 << i);
//    Extra_PrintBinary( stdout, &uWord, 16 ); printf( "\n" );
    return (int)uWord;
}